

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void __thiscall Executor::visit(Executor *this,UnaryNode *node)

{
  UnaryOperator UVar1;
  ExpressionNode *pEVar2;
  Value *pVVar3;
  const_iterator cVar4;
  Value *pVVar5;
  Executor *this_00;
  NumberValueAnalyser analyser;
  undefined8 local_68;
  TypeName local_4c;
  undefined **local_48;
  undefined1 local_40;
  _Map_pointer local_38;
  char local_30;
  
  pEVar2 = (node->term_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar2->super_Node)._vptr_Node + 0x10))(pEVar2,this);
  pVVar3 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  local_4c = F32;
  cVar4 = std::
          _Hashtable<UnaryOperator,_std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<UnaryOperator>,_std::hash<UnaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&UnaryOperationNames_abi_cxx11_._M_h,&node->unaryOperator_);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  else {
    this_00 = (Executor *)&stack0xffffffffffffffb8;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb8,"unary operation ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)cVar4.
                          super__Node_iterator_base<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          ._M_cur + 0x10));
    assertValueType(this_00,pVVar3,&local_4c,(string *)&stack0xffffffffffffffb8,(Node *)node);
    if ((_Map_pointer *)local_48 != &stack0xffffffffffffffc8) {
      operator_delete(local_48,(long)local_38 + 1);
    }
    local_48 = &PTR__ValueVisitor_00150c80;
    local_40 = 0;
    local_30 = '\0';
    (*((this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
       super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
       super__Head_base<0UL,_Value_*,_false>._M_head_impl)->_vptr_Value[3])();
    if (local_30 != '\0') {
      local_68 = local_38;
      UVar1 = node->unaryOperator_;
      if (UVar1 == BinaryNegation) {
        local_68 = (_Map_pointer)(double)~(uint)(long)(double)local_38;
      }
      else if (UVar1 == Minus) {
        local_68 = (_Map_pointer)((ulong)local_38 ^ 0x8000000000000000);
      }
      else if (UVar1 == LogicalNot) {
        local_68 = (_Map_pointer)(-(ulong)((double)local_38 == 0.0) & 0x3ff0000000000000);
      }
      pVVar5 = (Value *)operator_new(0x18);
      pVVar5->valueType_ = F32;
      pVVar5->_vptr_Value = (_func_int **)&PTR__Value_00150ba8;
      *(undefined4 *)&pVVar5[1]._vptr_Value = (undefined4)local_68;
      *(undefined4 *)((long)&pVVar5[1]._vptr_Value + 4) = local_68._4_4_;
      pVVar3 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
               super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
               super__Head_base<0UL,_Value_*,_false>._M_head_impl;
      (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
      super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
      super__Head_base<0UL,_Value_*,_false>._M_head_impl = pVVar5;
      if (pVVar3 != (Value *)0x0) {
        (*pVVar3->_vptr_Value[1])();
      }
      return;
    }
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::visit(const UnaryNode& node)
{
  node.getTerm().accept(*this);

  assertValueType(*value_, TypeName::F32,
    "unary operation " + UnaryOperationNames.at(node.getOperation()), node);

  NumberValueAnalyser analyser{};
  value_->accept(analyser);
  auto term = analyser.getValue().value();
  auto newValue = term;
  switch(node.getOperation())
  {
    case UnaryOperator::BinaryNegation:
      newValue = ~static_cast<unsigned int>(term);
      break;
    case UnaryOperator::LogicalNot:
      newValue = term == 0 ? 1 : 0;
      break;
    case UnaryOperator::Minus:
      newValue = -term;
      break;
  }

  value_ = std::make_unique<Number>(newValue);
}